

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

void __thiscall
icu_63::Locale::getUnicodeKeywordValue
          (Locale *this,StringPiece keywordName,ByteSink *sink,UErrorCode *status)

{
  UBool UVar1;
  char *pcVar2;
  char *value;
  size_t sVar3;
  StringPiece s;
  StringPiece keywordName_00;
  char *unicode_value;
  undefined4 local_f8;
  undefined1 local_f0 [8];
  CharStringByteSink sink_1;
  CharString legacy_value;
  char *legacy_key;
  undefined1 local_70 [8];
  CharString keywordName_nul;
  UErrorCode *status_local;
  ByteSink *sink_local;
  Locale *this_local;
  StringPiece keywordName_local;
  
  s._12_4_ = 0;
  s.ptr_ = (char *)SUB128(keywordName._0_12_,0);
  s.length_ = SUB124(keywordName._0_12_,8);
  keywordName_nul._56_8_ = status;
  CharString::CharString((CharString *)local_70,s,status);
  UVar1 = ::U_FAILURE(*(UErrorCode *)keywordName_nul._56_8_);
  if (UVar1 == '\0') {
    pcVar2 = CharString::data((CharString *)local_70);
    pcVar2 = uloc_toLegacyKey_63(pcVar2);
    if (pcVar2 == (char *)0x0) {
      *(undefined4 *)keywordName_nul._56_8_ = 1;
    }
    else {
      CharString::CharString((CharString *)&sink_1.dest_);
      CharStringByteSink::CharStringByteSink
                ((CharStringByteSink *)local_f0,(CharString *)&sink_1.dest_);
      StringPiece::StringPiece((StringPiece *)&unicode_value,pcVar2);
      keywordName_00._12_4_ = 0;
      keywordName_00.ptr_ = unicode_value;
      keywordName_00.length_ = local_f8;
      getKeywordValue(this,keywordName_00,(ByteSink *)local_f0,(UErrorCode *)keywordName_nul._56_8_)
      ;
      CharStringByteSink::~CharStringByteSink((CharStringByteSink *)local_f0);
      UVar1 = ::U_FAILURE(*(UErrorCode *)keywordName_nul._56_8_);
      if (UVar1 == '\0') {
        pcVar2 = CharString::data((CharString *)local_70);
        value = CharString::data((CharString *)&sink_1.dest_);
        pcVar2 = uloc_toUnicodeLocaleType_63(pcVar2,value);
        if (pcVar2 == (char *)0x0) {
          *(undefined4 *)keywordName_nul._56_8_ = 1;
        }
        else {
          sVar3 = strlen(pcVar2);
          (*sink->_vptr_ByteSink[2])(sink,pcVar2,sVar3 & 0xffffffff);
        }
      }
      CharString::~CharString((CharString *)&sink_1.dest_);
    }
  }
  CharString::~CharString((CharString *)local_70);
  return;
}

Assistant:

void
Locale::getUnicodeKeywordValue(StringPiece keywordName,
                               ByteSink& sink,
                               UErrorCode& status) const {
    // TODO: Remove the need for a const char* to a NUL terminated buffer.
    const CharString keywordName_nul(keywordName, status);
    if (U_FAILURE(status)) {
        return;
    }

    const char* legacy_key = uloc_toLegacyKey(keywordName_nul.data());

    if (legacy_key == nullptr) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    CharString legacy_value;
    {
        CharStringByteSink sink(&legacy_value);
        getKeywordValue(legacy_key, sink, status);
    }

    if (U_FAILURE(status)) {
        return;
    }

    const char* unicode_value = uloc_toUnicodeLocaleType(
            keywordName_nul.data(), legacy_value.data());

    if (unicode_value == nullptr) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    sink.Append(unicode_value, static_cast<int32_t>(uprv_strlen(unicode_value)));
}